

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_lshd(mp_int *a,int b)

{
  mp_digit *__s;
  uint uVar1;
  mp_digit *pmVar2;
  ulong uVar3;
  int iVar4;
  
  if (0 < b) {
    iVar4 = a->used + b;
    if ((a->alloc < iVar4) && (iVar4 = mp_grow(a,iVar4), iVar4 != 0)) {
      return iVar4;
    }
    iVar4 = a->used;
    uVar1 = iVar4 + b;
    a->used = uVar1;
    __s = a->dp;
    if (0 < iVar4) {
      pmVar2 = __s + uVar1;
      do {
        pmVar2 = pmVar2 + -1;
        uVar1 = uVar1 - 1;
        *pmVar2 = pmVar2[-(ulong)(uint)b];
      } while (b < (int)uVar1);
    }
    uVar3 = 1;
    if (1 < b) {
      uVar3 = (ulong)(uint)b;
    }
    memset(__s,0,uVar3 << 3);
  }
  return 0;
}

Assistant:

int mp_lshd (mp_int * a, int b)
{
  int     x, res;

  /* if its less than zero return */
  if (b <= 0) {
    return MP_OKAY;
  }

  /* grow to fit the new digits */
  if (a->alloc < a->used + b) {
     if ((res = mp_grow (a, a->used + b)) != MP_OKAY) {
       return res;
     }
  }

  {
    register mp_digit *top, *bottom;

    /* increment the used by the shift amount then copy upwards */
    a->used += b;

    /* top */
    top = a->dp + a->used - 1;

    /* base */
    bottom = a->dp + a->used - 1 - b;

    /* much like mp_rshd this is implemented using a sliding window
     * except the window goes the otherway around.  Copying from
     * the bottom to the top.  see bn_mp_rshd.c for more info.
     */
    for (x = a->used - 1; x >= b; x--) {
      *top-- = *bottom--;
    }

    /* zero the lower digits */
    top = a->dp;
    for (x = 0; x < b; x++) {
      *top++ = 0;
    }
  }
  return MP_OKAY;
}